

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

float __thiscall gui::Slider::getThumbWidth(Slider *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->step_;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = floorf(((this->range_).second - (this->range_).first) / fVar2);
    fVar2 = fVar2 + 1.0;
  }
  else {
    fVar2 = (this->size_).x;
  }
  fVar2 = (this->size_).x / fVar2;
  fVar1 = ((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thumbMinWidth_;
  if (fVar1 <= fVar2) {
    fVar1 = fVar2;
  }
  return fVar1;
}

Assistant:

float Slider::getThumbWidth() const {
    float numThumbPositions;
    if (step_ == 0.0f) {
        numThumbPositions = size_.x;
    } else {
        numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
    }
    return std::max(size_.x / numThumbPositions, style_->thumbMinWidth_);
}